

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Error processInternalEntity(XML_Parser parser,ENTITY *entity,XML_Bool betweenDecl)

{
  char *s;
  ENCODING *enc;
  int iVar1;
  XML_Error XVar2;
  OPEN_INTERNAL_ENTITY *pOVar3;
  char *end;
  char *next;
  
  pOVar3 = parser->m_freeInternalEntities;
  if (pOVar3 == (OPEN_INTERNAL_ENTITY *)0x0) {
    pOVar3 = (OPEN_INTERNAL_ENTITY *)(*(parser->m_mem).malloc_fcn)(0x28);
    if (pOVar3 == (OPEN_INTERNAL_ENTITY *)0x0) {
      return XML_ERROR_NO_MEMORY;
    }
  }
  else {
    parser->m_freeInternalEntities = pOVar3->next;
  }
  entity->open = '\x01';
  entityTrackingOnOpen(parser,entity,0x16d9);
  entity->processed = 0;
  pOVar3->next = parser->m_openInternalEntities;
  parser->m_openInternalEntities = pOVar3;
  pOVar3->entity = entity;
  iVar1 = parser->m_tagLevel;
  pOVar3->startTagLevel = iVar1;
  pOVar3->betweenDecl = betweenDecl;
  pOVar3->internalEventPtr = (char *)0x0;
  pOVar3->internalEventEndPtr = (char *)0x0;
  s = entity->textPtr;
  end = s + entity->textLen;
  enc = parser->m_internalEncoding;
  next = s;
  if (entity->is_param == '\0') {
    XVar2 = doContent(parser,iVar1,enc,s,end,&next,'\0',XML_ACCOUNT_ENTITY_EXPANSION);
  }
  else {
    iVar1 = (*enc->scanners[0])(enc,s,end,&next);
    XVar2 = doProlog(parser,parser->m_internalEncoding,s,end,iVar1,next,&next,'\0','\0',
                     XML_ACCOUNT_ENTITY_EXPANSION);
  }
  if (XVar2 == XML_ERROR_NONE) {
    if ((end == next) || ((parser->m_parsingStatus).parsing != XML_SUSPENDED)) {
      XVar2 = XML_ERROR_NONE;
      if (parser->m_openInternalEntities->entity == entity) {
        entityTrackingOnClose(parser,entity,0x16fa);
        entity->open = '\0';
        parser->m_openInternalEntities = pOVar3->next;
        pOVar3->next = parser->m_freeInternalEntities;
        parser->m_freeInternalEntities = pOVar3;
      }
    }
    else {
      entity->processed = (int)next - (int)s;
      parser->m_processor = internalEntityProcessor;
      XVar2 = XML_ERROR_NONE;
    }
  }
  return XVar2;
}

Assistant:

static enum XML_Error
processInternalEntity(XML_Parser parser, ENTITY *entity, XML_Bool betweenDecl) {
  const char *textStart, *textEnd;
  const char *next;
  enum XML_Error result;
  OPEN_INTERNAL_ENTITY *openEntity;

  if (parser->m_freeInternalEntities) {
    openEntity = parser->m_freeInternalEntities;
    parser->m_freeInternalEntities = openEntity->next;
  } else {
    openEntity
        = (OPEN_INTERNAL_ENTITY *)MALLOC(parser, sizeof(OPEN_INTERNAL_ENTITY));
    if (! openEntity)
      return XML_ERROR_NO_MEMORY;
  }
  entity->open = XML_TRUE;
#if XML_GE == 1
  entityTrackingOnOpen(parser, entity, __LINE__);
#endif
  entity->processed = 0;
  openEntity->next = parser->m_openInternalEntities;
  parser->m_openInternalEntities = openEntity;
  openEntity->entity = entity;
  openEntity->startTagLevel = parser->m_tagLevel;
  openEntity->betweenDecl = betweenDecl;
  openEntity->internalEventPtr = NULL;
  openEntity->internalEventEndPtr = NULL;
  textStart = (const char *)entity->textPtr;
  textEnd = (const char *)(entity->textPtr + entity->textLen);
  /* Set a safe default value in case 'next' does not get set */
  next = textStart;

  if (entity->is_param) {
    int tok
        = XmlPrologTok(parser->m_internalEncoding, textStart, textEnd, &next);
    result = doProlog(parser, parser->m_internalEncoding, textStart, textEnd,
                      tok, next, &next, XML_FALSE, XML_FALSE,
                      XML_ACCOUNT_ENTITY_EXPANSION);
  } else {
    result = doContent(parser, parser->m_tagLevel, parser->m_internalEncoding,
                       textStart, textEnd, &next, XML_FALSE,
                       XML_ACCOUNT_ENTITY_EXPANSION);
  }

  if (result == XML_ERROR_NONE) {
    if (textEnd != next && parser->m_parsingStatus.parsing == XML_SUSPENDED) {
      entity->processed = (int)(next - textStart);
      parser->m_processor = internalEntityProcessor;
    } else if (parser->m_openInternalEntities->entity == entity) {
#if XML_GE == 1
      entityTrackingOnClose(parser, entity, __LINE__);
#endif /* XML_GE == 1 */
      entity->open = XML_FALSE;
      parser->m_openInternalEntities = openEntity->next;
      /* put openEntity back in list of free instances */
      openEntity->next = parser->m_freeInternalEntities;
      parser->m_freeInternalEntities = openEntity;
    }
  }
  return result;
}